

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O0

ParseStatus __thiscall HTTPRequest::parse(HTTPRequest *this)

{
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  mapped_type *pmVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  tuple<char_const*&,long&> local_118 [16];
  undefined1 local_108 [24];
  string local_f0 [32];
  string local_d0 [32];
  _Self local_b0 [3];
  allocator local_91;
  string local_90 [32];
  _Self local_70;
  tuple<char_const*&,long&> local_68 [16];
  undefined1 local_58 [16];
  char *local_48 [2];
  undefined1 local_38 [24];
  ssize_t size;
  char *str;
  HTTPRequest *this_local;
  
  str = (char *)this;
  switch(this->status) {
  case WAITING_REQUEST_LINE:
    if (this->status != WAITING_REQUEST_LINE) {
      fprintf(_stderr,"%s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/http_request.cpp"
              ,0x20);
      fprintf(_stderr,"--> %s\n","this->status == WAITING_REQUEST_LINE");
      perror("info");
      exit(1);
    }
    ReadBuffer::get_line((ReadBuffer *)local_38);
    std::tie<char_const*,long>(local_48,&size);
    std::tuple<char_const*&,long&>::operator=
              ((tuple<char_const*&,long&> *)local_48,(tuple<const_char_*,_long> *)local_38);
    if (size == 0) {
      return PARSE_FAILED;
    }
    iVar2 = parse_request_line(this,(char *)size,local_38._16_8_);
    if (iVar2 != 0) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "ErrorParseRequestLine";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
    this->status = WAITING_HEADER;
  case WAITING_HEADER:
    if (this->status != WAITING_HEADER) {
      fprintf(_stderr,"%s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/http_request.cpp"
              ,0x26);
      fprintf(_stderr,"--> %s\n","this->status == WAITING_HEADER");
      perror("info");
      exit(1);
    }
    while( true ) {
      ReadBuffer::get_line((ReadBuffer *)local_58);
      std::tie<char_const*,long>((char **)local_68,&size);
      std::tuple<char_const*&,long&>::operator=(local_68,(tuple<const_char_*,_long> *)local_58);
      if (size == 0) {
        return PARSE_FAILED;
      }
      if (local_38._16_8_ == 0) break;
      iVar2 = parse_header_line(this,(char *)size,local_38._16_8_);
      if (iVar2 != 0) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = "ErrorParseHeader";
        __cxa_throw(puVar3,&char_const*::typeinfo,0);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Content-Length",&local_91);
    local_70._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->header,(key_type *)local_90);
    local_b0[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->header);
    bVar1 = std::operator!=(&local_70,local_b0);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"Content-Length",(allocator *)(local_108 + 0x17));
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->header,(key_type *)local_f0);
      std::__cxx11::string::string(local_d0,(string *)pmVar4);
      sVar5 = string_to_size_t((string *)local_d0);
      this->content_length = sVar5;
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)(local_108 + 0x17));
      if (this->content != (char *)0x0) {
        if (this->content != (char *)0x0) {
          operator_delete(this->content);
        }
        this->content = (char *)0x0;
      }
      uVar7 = this->content_length;
      if ((long)uVar7 < 0) {
        uVar7 = 0xffffffffffffffff;
      }
      pcVar6 = (char *)operator_new__(uVar7);
      this->content = pcVar6;
      this->content_received = 0;
    }
    else {
      this->content_length = 0;
    }
    this->status = WAITING_CONTENT;
  case WAITING_CONTENT:
    if (this->status != WAITING_CONTENT) {
      fprintf(_stderr,"%s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/http_request.cpp"
              ,0x3d);
      fprintf(_stderr,"--> %s\n","this->status == WAITING_CONTENT");
      perror("info");
      exit(1);
    }
    if ((this->content_length == 0) || (this->content_length == this->content_received)) {
      this->status = GET_A_REQUEST;
    }
    else {
      ReadBuffer::get_chars((ReadBuffer *)local_108,(ssize_t)&this->buffer);
      std::tie<char_const*,long>((char **)local_118,&size);
      std::tuple<char_const*&,long&>::operator=(local_118,(tuple<const_char_*,_long> *)local_108);
      if (size == 0) {
        return PARSE_FAILED;
      }
      memcpy(this->content + this->content_received,(void *)size,local_38._16_8_);
      this->content_received = local_38._16_8_ + this->content_received;
      if (this->content_received != this->content_length) {
        return PARSE_FAILED;
      }
      this->status = GET_A_REQUEST;
    }
  case GET_A_REQUEST:
    if (this->status == GET_A_REQUEST) {
      return PARSE_NEW_REQUEST;
    }
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/http_request.cpp"
            ,0x4c);
    fprintf(_stderr,"--> %s\n","this->status == GET_A_REQUEST");
    perror("info");
    exit(1);
  default:
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/http_request.cpp"
            ,0x4f);
    fprintf(_stderr,"--> %s\n","false");
    perror("info");
    exit(1);
  }
}

Assistant:

ParseStatus HTTPRequest::parse() {
    const char *str;
    ssize_t size;
    switch (this->status) {
        case WAITING_REQUEST_LINE:
            IF_FALSE_EXIT(this->status == WAITING_REQUEST_LINE);
            std::tie(str, size) = this->buffer.get_line();
            if (str == nullptr) return PARSE_FAILED;
            if (this->parse_request_line(str, size) != 0) throw "ErrorParseRequestLine";
            this->status = WAITING_HEADER;
        case WAITING_HEADER:
            IF_FALSE_EXIT(this->status == WAITING_HEADER);
            while (1) {
                std::tie(str, size) = this->buffer.get_line();
                if (str == nullptr) return PARSE_FAILED;
                if (size != 0) {
                    if (this->parse_header_line(str, size) != 0) throw "ErrorParseHeader";
                } else {
                    if (this->header.find("Content-Length") != this->header.end()) {
                        this->content_length = string_to_size_t(this->header["Content-Length"]);
                        if (this->content != nullptr) {
                            delete this->content;
                            this->content = nullptr;
                        }
                        this->content = new char[this->content_length];
                        this->content_received = 0;
                    } else {
                        this->content_length = 0;
                    }
                    this->status = WAITING_CONTENT;
                    break;
                }
            }
        case WAITING_CONTENT:
            IF_FALSE_EXIT(this->status == WAITING_CONTENT);
            if (this->content_length == 0 || this->content_length == this->content_received) {
                this->status = GET_A_REQUEST;
            } else {
                std::tie(str, size) = this->buffer.get_chars(this->content_length - this->content_received);
                if (str == nullptr) return PARSE_FAILED;
                memcpy(this->content + this->content_received, str, size * sizeof(char));
                this->content_received += size;
                if (this->content_received == this->content_length) {
                    this->status = GET_A_REQUEST;
                } else {
                    return PARSE_FAILED;
                }
            }
        case GET_A_REQUEST:
            IF_FALSE_EXIT(this->status == GET_A_REQUEST);
            return PARSE_NEW_REQUEST;
        default:
            IF_FALSE_EXIT(false);
    }
}